

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

void ScaWrd(GmfMshSct *msh,void *ptr)

{
  undefined1 uVar1;
  size_t sVar2;
  long lVar3;
  undefined1 *puVar4;
  
  sVar2 = fread(ptr,4,1,(FILE *)msh->hdl);
  if (sVar2 == 1) {
    if (msh->cod != 1) {
      lVar3 = 3;
      puVar4 = (undefined1 *)ptr;
      do {
        uVar1 = *(undefined1 *)((long)ptr + lVar3);
        *(undefined1 *)((long)ptr + lVar3) = *puVar4;
        *puVar4 = uVar1;
        lVar3 = lVar3 + -1;
        puVar4 = puVar4 + 1;
      } while (lVar3 != 1);
    }
    return;
  }
  longjmp((__jmp_buf_tag *)msh->err,-0x1a);
}

Assistant:

static void ScaWrd(GmfMshSct *msh, void *ptr)
{
#ifdef WITH_GMF_AIO
   if(read(msh->FilDes, ptr, WrdSiz) != WrdSiz)
#else
   if(fread(ptr, WrdSiz, 1, msh->hdl) != 1)
#endif
      longjmp(msh->err, -26);

   if(msh->cod != 1)
      SwpWrd((char *)ptr, WrdSiz);
}